

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.c
# Opt level: O2

void class2(int *ip)

{
  int iVar1;
  
  loccnt = loccnt + 2;
  iVar1 = evaluate(ip,';');
  if ((iVar1 != 0) && (pass == 1)) {
    putbyte(data_loccnt,opval);
    iVar1 = value - (page * 0x2000 + loccnt);
    if ((char)iVar1 != iVar1) {
      error("Branch address out of range!");
      return;
    }
    putbyte(data_loccnt + 1,iVar1);
    println();
    return;
  }
  return;
}

Assistant:

void
class2(int *ip)
{
	unsigned int addr;

	/* update location counter */
	loccnt += 2;

	/* get destination address */
	if (!evaluate(ip, ';'))
		return;

	/* generate code */
	if (pass == LAST_PASS) {
		/* opcode */
		putbyte(data_loccnt, opval);

		/* calculate branch offset */
		addr = value - (loccnt + (page << 13));

		/* check range */
		if (addr > 0x7F && addr < 0xFFFFFF80) {
			error("Branch address out of range!");
			return;
		}

		/* offset */
		putbyte(data_loccnt+1, addr);

		/* output line */
		println();
	}
}